

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O2

bool __thiscall
duckdb::TopNHeap::CheckBoundaryValues
          (TopNHeap *this,DataChunk *sort_chunk,DataChunk *payload,
          TopNBoundaryValue *global_boundary)

{
  string *__rhs;
  DataChunk *this_00;
  DataChunk *this_01;
  SelectionVector *true_sel;
  SelectionVector *false_sel;
  SelectionVector *sel_vector;
  Vector *pVVar1;
  vector<duckdb::BoundOrderByNode,_true> *this_02;
  pointer pBVar2;
  pointer pBVar3;
  bool bVar4;
  reference pvVar5;
  reference pvVar6;
  const_reference pvVar7;
  idx_t iVar8;
  idx_t count;
  Vector *col;
  Vector *this_03;
  vector<duckdb::OrderModifiers,_true> *in_R9;
  ulong __n;
  string_t sort_key;
  ulong local_98;
  SelectionVector remaining_sel;
  anon_union_16_2_67f50693_for_value local_60;
  string current_boundary_val;
  
  TopNBoundaryValue::GetBoundaryValue_abi_cxx11_(&current_boundary_val,global_boundary);
  if (current_boundary_val._M_string_length == 0) {
    bVar4 = true;
  }
  else {
    __rhs = &this->boundary_val;
    bVar4 = ::std::operator!=(&current_boundary_val,__rhs);
    if (bVar4) {
      ::std::__cxx11::string::operator=((string *)__rhs,(string *)&current_boundary_val);
      DataChunk::Reset(&this->boundary_values);
      string_t::string_t((string_t *)&local_60.pointer,__rhs);
      sort_key.value.pointer.ptr = (char *)&this->boundary_values;
      sort_key.value._0_8_ = local_60.pointer.ptr;
      CreateSortKeyHelpers::DecodeSortKey
                ((CreateSortKeyHelpers *)local_60._0_8_,sort_key,(DataChunk *)0x0,
                 (idx_t)&this->modifiers,in_R9);
      pVVar1 = (this->boundary_values).data.
               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (this_03 = (this->boundary_values).data.
                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start; this_03 != pVVar1; this_03 = this_03 + 1) {
        Vector::SetVectorType(this_03,CONSTANT_VECTOR);
      }
    }
    (this->boundary_values).count = sort_chunk->count;
    SelectionVector::SelectionVector(&remaining_sel,(sel_t *)0x0);
    this_00 = &this->boundary_values;
    count = sort_chunk->count;
    this_01 = &this->compare_chunk;
    true_sel = &this->true_sel;
    false_sel = &this->false_sel;
    sel_vector = &this->final_sel;
    local_98 = 0;
    __n = 0;
    while (__n < (ulong)(((long)(this->orders->
                                super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                ).
                                super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->orders->
                               super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                               ).
                               super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
      if (remaining_sel.sel_vector == (sel_t *)0x0) {
        pvVar5 = vector<duckdb::Vector,_true>::get<true>(&this_01->data,__n);
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&sort_chunk->data,__n);
        Vector::Reference(pvVar5,pvVar6);
      }
      else {
        pvVar5 = vector<duckdb::Vector,_true>::get<true>(&this_01->data,__n);
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&sort_chunk->data,__n);
        Vector::Slice(pvVar5,pvVar6,&remaining_sel,count);
      }
      this_02 = this->orders;
      pBVar2 = (this_02->
               super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
               super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pBVar3 = (this_02->
               super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
               super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar7 = vector<duckdb::BoundOrderByNode,_true>::get<true>(this_02,__n);
      if (pvVar7->null_order == NULLS_LAST) {
        pvVar7 = vector<duckdb::BoundOrderByNode,_true>::get<true>(this->orders,__n);
        if (pvVar7->type == ASCENDING) {
          pvVar5 = vector<duckdb::Vector,_true>::get<true>(&this_01->data,__n);
          pvVar6 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,__n);
          iVar8 = VectorOperations::DistinctLessThan
                            (pvVar5,pvVar6,&remaining_sel,count,
                             (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                             (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                             (optional_ptr<duckdb::ValidityMask,_true>)0x0);
        }
        else {
          pvVar5 = vector<duckdb::Vector,_true>::get<true>(&this_01->data,__n);
          pvVar6 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,__n);
          iVar8 = VectorOperations::DistinctGreaterThanNullsFirst
                            (pvVar5,pvVar6,&remaining_sel,count,
                             (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                             (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                             (optional_ptr<duckdb::ValidityMask,_true>)0x0);
        }
      }
      else {
        pvVar7 = vector<duckdb::BoundOrderByNode,_true>::get<true>(this->orders,__n);
        if (pvVar7->type == ASCENDING) {
          pvVar5 = vector<duckdb::Vector,_true>::get<true>(&this_01->data,__n);
          pvVar6 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,__n);
          iVar8 = VectorOperations::DistinctLessThanNullsFirst
                            (pvVar5,pvVar6,&remaining_sel,count,
                             (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                             (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                             (optional_ptr<duckdb::ValidityMask,_true>)0x0);
        }
        else {
          pvVar5 = vector<duckdb::Vector,_true>::get<true>(&this_01->data,__n);
          pvVar6 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,__n);
          iVar8 = VectorOperations::DistinctGreaterThan
                            (pvVar5,pvVar6,&remaining_sel,count,
                             (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                             (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                             (optional_ptr<duckdb::ValidityMask,_true>)0x0);
        }
      }
      if (iVar8 != 0) {
        switchD_01939fa4::default(sel_vector->sel_vector + local_98,true_sel->sel_vector,iVar8 * 4);
        local_98 = local_98 + iVar8;
      }
      if ((__n + 1 == ((long)pBVar2 - (long)pBVar3) / 0x18) || (count == iVar8)) break;
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&this_01->data,__n);
      pvVar6 = vector<duckdb::Vector,_true>::get<true>(&sort_chunk->data,__n);
      Vector::Slice(pvVar5,pvVar6,false_sel,count - iVar8);
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&this_01->data,__n);
      pvVar6 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,__n);
      count = VectorOperations::NotDistinctFrom
                        (pvVar5,pvVar6,(optional_ptr<const_duckdb::SelectionVector,_true>)false_sel,
                         count - iVar8,
                         (optional_ptr<duckdb::SelectionVector,_true>)&this->new_remaining_sel,
                         (optional_ptr<duckdb::SelectionVector,_true>)0x0);
      SelectionVector::Initialize(&remaining_sel,&this->new_remaining_sel);
      __n = __n + 1;
    }
    bVar4 = local_98 != 0;
    if ((bVar4) && (local_98 < sort_chunk->count)) {
      DataChunk::Slice(sort_chunk,sel_vector,local_98);
      DataChunk::Slice(payload,sel_vector,local_98);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&remaining_sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  ::std::__cxx11::string::~string((string *)&current_boundary_val);
  return bVar4;
}

Assistant:

bool TopNHeap::CheckBoundaryValues(DataChunk &sort_chunk, DataChunk &payload, TopNBoundaryValue &global_boundary) {
	// get the global boundary value
	auto current_boundary_val = global_boundary.GetBoundaryValue();
	if (current_boundary_val.empty()) {
		// no boundary value (yet) - don't do anything
		return true;
	}
	if (current_boundary_val != boundary_val) {
		// new boundary value - decode
		boundary_val = std::move(current_boundary_val);
		boundary_values.Reset();
		CreateSortKeyHelpers::DecodeSortKey(string_t(boundary_val), boundary_values, 0, modifiers);
		for (auto &col : boundary_values.data) {
			col.SetVectorType(VectorType::CONSTANT_VECTOR);
		}
	}
	boundary_values.SetCardinality(sort_chunk.size());

	// we have boundary values
	// from these boundary values, determine which values we should insert (if any)
	idx_t final_count = 0;

	SelectionVector remaining_sel(nullptr);
	idx_t remaining_count = sort_chunk.size();
	for (idx_t i = 0; i < orders.size(); i++) {
		if (remaining_sel.data()) {
			compare_chunk.data[i].Slice(sort_chunk.data[i], remaining_sel, remaining_count);
		} else {
			compare_chunk.data[i].Reference(sort_chunk.data[i]);
		}
		bool is_last = i + 1 == orders.size();
		idx_t true_count;
		if (orders[i].null_order == OrderByNullType::NULLS_LAST) {
			if (orders[i].type == OrderType::ASCENDING) {
				true_count = VectorOperations::DistinctLessThan(compare_chunk.data[i], boundary_values.data[i],
				                                                &remaining_sel, remaining_count, &true_sel, &false_sel);
			} else {
				true_count = VectorOperations::DistinctGreaterThanNullsFirst(compare_chunk.data[i],
				                                                             boundary_values.data[i], &remaining_sel,
				                                                             remaining_count, &true_sel, &false_sel);
			}
		} else {
			D_ASSERT(orders[i].null_order == OrderByNullType::NULLS_FIRST);
			if (orders[i].type == OrderType::ASCENDING) {
				true_count = VectorOperations::DistinctLessThanNullsFirst(compare_chunk.data[i],
				                                                          boundary_values.data[i], &remaining_sel,
				                                                          remaining_count, &true_sel, &false_sel);
			} else {
				true_count =
				    VectorOperations::DistinctGreaterThan(compare_chunk.data[i], boundary_values.data[i],
				                                          &remaining_sel, remaining_count, &true_sel, &false_sel);
			}
		}

		if (true_count > 0) {
			memcpy(final_sel.data() + final_count, true_sel.data(), true_count * sizeof(sel_t));
			final_count += true_count;
		}
		idx_t false_count = remaining_count - true_count;
		if (!is_last && false_count > 0) {
			// check what we should continue to check
			compare_chunk.data[i].Slice(sort_chunk.data[i], false_sel, false_count);
			remaining_count = VectorOperations::NotDistinctFrom(compare_chunk.data[i], boundary_values.data[i],
			                                                    &false_sel, false_count, &new_remaining_sel, nullptr);
			remaining_sel.Initialize(new_remaining_sel);
		} else {
			break;
		}
	}
	if (final_count == 0) {
		return false;
	}
	if (final_count < sort_chunk.size()) {
		sort_chunk.Slice(final_sel, final_count);
		payload.Slice(final_sel, final_count);
	}
	return true;
}